

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall
QScroller::ensureVisible(QScroller *this,QRectF *rect,qreal xmargin,qreal ymargin,int scrollTime)

{
  QScrollerPrivate *this_00;
  double dVar1;
  bool bVar2;
  char cVar3;
  QDebug *pQVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  qreal qVar7;
  QPointF QVar8;
  QPointF local_d8;
  QPointF local_c8;
  undefined4 uStack_b8;
  undefined4 local_b4;
  char *local_b0;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  qreal local_88;
  qreal local_80;
  double local_78;
  double dStack_70;
  QPointF local_68;
  double local_58;
  double dStack_50;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d_ptr;
  if (this_00->state - Pressed < 2) goto LAB_005dc0a5;
  if (this_00->state == Inactive) {
    local_68.xp = 0.0;
    local_68.yp = 0.0;
    bVar2 = QScrollerPrivate::prepareScrolling(this_00,&local_68);
    if (!bVar2) goto LAB_005dc0a5;
  }
  qVar7 = QScrollerPrivate::scrollingSegmentsEndPos(this_00,Horizontal);
  local_80 = QScrollerPrivate::scrollingSegmentsEndPos(this_00,Vertical);
  local_68.xp = rect->xp - xmargin;
  local_68.yp = rect->yp - ymargin;
  local_58 = xmargin + xmargin + rect->w;
  dStack_50 = ymargin + ymargin + rect->h;
  dVar6 = (this_00->viewportSize).wd;
  dVar1 = (this_00->viewportSize).ht;
  local_88 = qVar7;
  local_78 = dVar6;
  dStack_70 = dVar1;
  local_48.xp = qVar7;
  local_48.yp = local_80;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_c8.xp._0_4_ = 2;
    local_c8.xp._4_4_ = 0;
    local_c8.yp._0_4_ = 0;
    local_c8.yp._4_4_ = 0;
    uStack_b8 = 0;
    local_b4 = 0;
    local_b0 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_a0,"QScroller::ensureVisible(");
    local_98.stream = pQVar4->stream;
    *(int *)(local_98.stream + 0x28) = *(int *)(local_98.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_90,(QRectF *)&local_98);
    pQVar4 = QDebug::operator<<(&local_90," [pix], ");
    pQVar4 = QDebug::operator<<(pQVar4,xmargin);
    pQVar4 = QDebug::operator<<(pQVar4," [pix], ");
    pQVar4 = QDebug::operator<<(pQVar4,ymargin);
    pQVar4 = QDebug::operator<<(pQVar4," [pix], ");
    pQVar4 = QDebug::operator<<(pQVar4,scrollTime);
    QDebug::operator<<(pQVar4,"[ms])");
    QDebug::~QDebug(&local_90);
    QDebug::~QDebug(&local_98);
    QDebug::~QDebug(&local_a0);
  }
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_c8.xp._0_4_ = 2;
    local_c8.xp._4_4_ = 0;
    local_c8.yp._0_4_ = 0;
    local_c8.yp._4_4_ = 0;
    uStack_b8 = 0;
    local_b4 = 0;
    local_b0 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_90,"  --> content position:");
    local_d8.xp = (qreal)pQVar4->stream;
    *(int *)((long)local_d8.xp + 0x28) = *(int *)((long)local_d8.xp + 0x28) + 1;
    ::operator<<((QDebug)&local_d8.yp,&local_d8);
    QDebug::~QDebug((QDebug *)&local_d8.yp);
    QDebug::~QDebug((QDebug *)&local_d8);
    QDebug::~QDebug(&local_90);
  }
  cVar3 = QRectF::contains((QRectF *)&local_88);
  if (cVar3 != '\0') goto LAB_005dc0a5;
  local_c8.xp._0_4_ = SUB84(local_48.xp,0);
  local_c8.xp._4_4_ = (undefined4)((ulong)local_48.xp >> 0x20);
  local_c8.yp._0_4_ = SUB84(local_48.yp,0);
  local_c8.yp._4_4_ = (undefined4)((ulong)local_48.yp >> 0x20);
  if (rect->w <= local_78) {
    dVar5 = local_58;
    qVar7 = local_68.xp;
    if (local_58 <= local_78) goto LAB_005dbf66;
    QVar8 = QRectF::center(rect);
    dVar6 = local_78 * -0.5 + QVar8.xp;
LAB_005dbf90:
    local_c8.xp._0_4_ = SUB84(dVar6,0);
    local_c8.xp._4_4_ = (undefined4)((ulong)dVar6 >> 0x20);
  }
  else {
    dVar5 = rect->w;
    qVar7 = rect->xp;
LAB_005dbf66:
    if (qVar7 <= local_88) {
      if (dVar5 + qVar7 < local_78 + local_88) {
        dVar6 = (dVar5 + qVar7) - dVar6;
        goto LAB_005dbf90;
      }
    }
    else {
      local_c8.xp._0_4_ = SUB84(qVar7,0);
      local_c8.xp._4_4_ = (undefined4)((ulong)qVar7 >> 0x20);
    }
  }
  dVar5 = (double)CONCAT44(local_c8.xp._4_4_,local_c8.xp._0_4_);
  dVar6 = (double)CONCAT44(local_c8.yp._4_4_,local_c8.yp._0_4_);
  if (rect->h <= dStack_70) {
    if (dStack_50 <= dStack_70) {
      local_c8.yp = local_68.yp;
      if ((local_68.yp <= local_80) &&
         (local_c8.yp = dVar6, local_c8.xp = (qreal)CONCAT44(local_c8.xp._4_4_,local_c8.xp._0_4_),
         dStack_50 + local_68.yp < dStack_70 + local_80)) {
        local_c8.yp = (dStack_50 + local_68.yp) - dVar1;
        local_c8.xp = (qreal)CONCAT44(local_c8.xp._4_4_,local_c8.xp._0_4_);
      }
    }
    else {
      QVar8 = QRectF::center(rect);
      local_c8.yp = dStack_70 * -0.5 + QVar8.yp;
      local_c8.xp = (qreal)CONCAT44(local_c8.xp._4_4_,local_c8.xp._0_4_);
    }
  }
  else {
    local_c8.xp = rect->yp;
    if ((local_c8.xp <= local_80) &&
       (dVar6 = rect->h + local_c8.xp,
       local_c8.yp = (qreal)CONCAT44(local_c8.yp._4_4_,local_c8.yp._0_4_), local_c8.xp = dVar5,
       dVar6 < dStack_70 + local_80)) {
      local_c8.yp = (qreal)CONCAT44(local_c8.yp._4_4_,local_c8.yp._0_4_);
      local_c8.xp = dVar6 - dVar1;
    }
  }
  QVar8 = clampToRect(&local_c8,&this_00->contentPosRange);
  local_c8.xp._0_4_ = QVar8.xp._0_4_;
  local_c8.xp._4_4_ = QVar8.xp._4_4_;
  local_c8.yp._0_4_ = QVar8.yp._0_4_;
  local_c8.yp._4_4_ = QVar8.yp._4_4_;
  bVar2 = qFuzzyCompare(&local_c8,&local_48);
  if (!bVar2) {
    scrollTo(this,&local_c8,scrollTime);
  }
LAB_005dc0a5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScroller::ensureVisible(const QRectF &rect, qreal xmargin, qreal ymargin, int scrollTime)
{
    Q_D(QScroller);

    if (d->state == Pressed || d->state == Dragging )
        return;

    if (d->state == Inactive && !d->prepareScrolling(QPointF()))
        return;

    // -- calculate the current pos (or the position after the current scroll)
    QPointF startPos(d->scrollingSegmentsEndPos(Qt::Horizontal),
                     d->scrollingSegmentsEndPos(Qt::Vertical));

    QRectF marginRect(rect.x() - xmargin, rect.y() - ymargin,
                      rect.width() + 2 * xmargin, rect.height() + 2 * ymargin);

    QSizeF visible = d->viewportSize;
    QRectF visibleRect(startPos, visible);

    qCDebug(lcScroller) << "QScroller::ensureVisible(" << rect << " [pix], " << xmargin
                        << " [pix], " << ymargin << " [pix], " << scrollTime << "[ms])";
    qCDebug(lcScroller) << "  --> content position:" << d->contentPosition;

    if (visibleRect.contains(marginRect))
        return;

    QPointF newPos = startPos;

    if (visibleRect.width() < rect.width()) {
        // at least try to move the rect into view
        if (rect.left() > visibleRect.left())
            newPos.setX(rect.left());
        else if (rect.right() < visibleRect.right())
            newPos.setX(rect.right() - visible.width());

    } else if (visibleRect.width() < marginRect.width()) {
        newPos.setX(rect.center().x() - visibleRect.width() / 2);
    } else if (marginRect.left() > visibleRect.left()) {
        newPos.setX(marginRect.left());
    } else if (marginRect.right() < visibleRect.right()) {
        newPos.setX(marginRect.right() - visible.width());
    }

    if (visibleRect.height() < rect.height()) {
        // at least try to move the rect into view
        if (rect.top() > visibleRect.top())
            newPos.setX(rect.top());
        else if (rect.bottom() < visibleRect.bottom())
            newPos.setX(rect.bottom() - visible.height());

    } else if (visibleRect.height() < marginRect.height()) {
        newPos.setY(rect.center().y() - visibleRect.height() / 2);
    } else if (marginRect.top() > visibleRect.top()) {
        newPos.setY(marginRect.top());
    } else if (marginRect.bottom() < visibleRect.bottom()) {
        newPos.setY(marginRect.bottom() - visible.height());
    }

    // clamp to maximum content position
    newPos = clampToRect(newPos, d->contentPosRange);
    if (newPos == startPos)
        return;

    scrollTo(newPos, scrollTime);
}